

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_details.cxx
# Opt level: O1

void __thiscall write_detail::operator()(write_detail *this,detail_object *detail,xr_writer *w)

{
  undefined8 in_RAX;
  float local_18;
  float local_14;
  
  local_14 = (float)((ulong)in_RAX >> 0x20);
  xray_re::xr_writer::w_raw_chunk(w,0x1000,&xray_re::DETOBJ_VERSION,4,false);
  xray_re::xr_writer::open_chunk(w,0x101);
  xray_re::xr_writer::w_sz(w,&detail->reference);
  xray_re::xr_writer::close_chunk(w);
  xray_re::xr_writer::open_chunk(w,0x102);
  _local_18 = CONCAT44(local_14,detail->min_scale);
  (*w->_vptr_xr_writer[2])(w,&local_18,4);
  _local_18 = CONCAT44(detail->max_scale,local_18);
  (*w->_vptr_xr_writer[2])(w,&local_14,4);
  xray_re::xr_writer::close_chunk(w);
  xray_re::xr_writer::w_raw_chunk(w,0x103,&detail->density,4,false);
  xray_re::xr_writer::w_raw_chunk(w,0x104,&detail->flags,4,false);
  return;
}

Assistant:

void operator()(const detail_object* detail, xr_writer& w) const {
	w.w_chunk(DETOBJ_CHUNK_VERSION, DETOBJ_VERSION);
	w.w_chunk(DETOBJ_CHUNK_REFERENCE, detail->reference);
	w.open_chunk(DETOBJ_CHUNK_SCALE_LIMITS);
	w.w_float(detail->min_scale);
	w.w_float(detail->max_scale);
	w.close_chunk();
	w.w_chunk(DETOBJ_CHUNK_DENSITY, detail->density);
	w.w_chunk(DETOBJ_CHUNK_FLAGS, detail->flags);
}